

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWRepository.cxx
# Opt level: O2

void __thiscall
cmCPackeIFWUpdatesPatcher::CharacterDataHandler
          (cmCPackeIFWUpdatesPatcher *this,char *data,int length)

{
  bool bVar1;
  string content;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,data,data + length);
  bVar1 = std::operator==(&local_30,"");
  if (!bVar1) {
    bVar1 = std::operator==(&local_30," ");
    if (!bVar1) {
      bVar1 = std::operator==(&local_30,"  ");
      if (!bVar1) {
        bVar1 = std::operator==(&local_30,"\n");
        if (!bVar1) {
          cmXMLWriter::Content<std::__cxx11::string>(this->xout,&local_30);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CharacterDataHandler(const char* data, int length) CM_OVERRIDE
  {
    std::string content(data, data + length);
    if (content == "" || content == " " || content == "  " ||
        content == "\n") {
      return;
    }
    this->xout.Content(content);
  }